

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O3

void __thiscall soplex::VectorBase<double>::reDim(VectorBase<double> *this,int newdim,bool setZero)

{
  pointer pdVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  value_type_conflict2 local_8;
  
  if ((int)CONCAT71(in_register_00000011,setZero) != 0) {
    pdVar1 = (this->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1;
    iVar3 = (int)(uVar4 >> 3);
    iVar2 = newdim - iVar3;
    if (iVar2 != 0 && iVar3 <= newdim) {
      local_8 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_insert
                (&this->val,(double *)((long)pdVar1 + uVar4),(long)iVar2,&local_8);
      return;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->val,(long)newdim);
  return;
}

Assistant:

void reDim(int newdim, const bool setZero = true)
   {
      if(setZero && newdim > dim())
      {
         // Inserts 0 to the rest of the vectors.
         //
         // TODO: Is this important after the change of raw pointers to
         // std::vector. This is just a waste of operations, I think.
         val.insert(val.end(), newdim - VectorBase<R>::dim(), 0);
      }
      else
      {
         val.resize(newdim);
      }

   }